

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O0

int Gia_IffObjCount(Gia_Man_t *pGia,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_28;
  int Count;
  int iFanin;
  int i;
  int iFaninSkip3_local;
  int iFaninSkip2_local;
  int iObj_local;
  Gia_Man_t *pGia_local;
  
  local_28 = 0;
  Gia_ManIncrementTravId(pGia);
  for (Count = 0; iVar1 = Gia_ObjLutSize(pGia,iObj), Count < iVar1; Count = Count + 1) {
    piVar3 = Gia_ObjLutFanins(pGia,iObj);
    iVar1 = piVar3[Count];
    if (((iVar1 != iFaninSkip2) && (iVar1 != iFaninSkip3)) &&
       (iVar2 = Gia_ObjIsTravIdCurrentId(pGia,iVar1), iVar2 == 0)) {
      Gia_ObjSetTravIdCurrentId(pGia,iVar1);
      local_28 = local_28 + 1;
    }
  }
  if (-1 < iFaninSkip2) {
    for (Count = 0; iVar1 = Gia_ObjLutSize(pGia,iFaninSkip2), Count < iVar1; Count = Count + 1) {
      piVar3 = Gia_ObjLutFanins(pGia,iFaninSkip2);
      iVar1 = piVar3[Count];
      if ((iVar1 != iFaninSkip3) && (iVar2 = Gia_ObjIsTravIdCurrentId(pGia,iVar1), iVar2 == 0)) {
        Gia_ObjSetTravIdCurrentId(pGia,iVar1);
        local_28 = local_28 + 1;
      }
    }
  }
  if (-1 < iFaninSkip3) {
    for (Count = 0; iVar1 = Gia_ObjLutSize(pGia,iFaninSkip3), Count < iVar1; Count = Count + 1) {
      piVar3 = Gia_ObjLutFanins(pGia,iFaninSkip3);
      iVar1 = piVar3[Count];
      if ((iVar1 != iFaninSkip2) && (iVar2 = Gia_ObjIsTravIdCurrentId(pGia,iVar1), iVar2 == 0)) {
        Gia_ObjSetTravIdCurrentId(pGia,iVar1);
        local_28 = local_28 + 1;
      }
    }
  }
  return local_28;
}

Assistant:

int Gia_IffObjCount( Gia_Man_t * pGia, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin, Count = 0;
    Gia_ManIncrementTravId( pGia );
    Gia_LutForEachFanin( pGia, iObj, iFanin, i )
    {
        if ( iFanin == iFaninSkip2 || iFanin == iFaninSkip3 )
            continue;
        if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
            continue;
        Gia_ObjSetTravIdCurrentId( pGia, iFanin );
        Count++;
    }
    if ( iFaninSkip2 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip2, iFanin, i )
        {
            if ( iFanin == iFaninSkip3 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    if ( iFaninSkip3 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip3, iFanin, i )
        {
            if ( iFanin == iFaninSkip2 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    return Count;
}